

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<RCCFileInfo*>::emplace<RCCFileInfo*&>
          (QPodArrayOps<RCCFileInfo_*> *this,qsizetype i,RCCFileInfo **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  RCCFileInfo **ppRVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<RCCFileInfo_*> *in_RDI;
  RCCFileInfo **where;
  GrowthPosition pos;
  RCCFileInfo *tmp;
  bool detach;
  QArrayDataPointer<RCCFileInfo_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  RCCFileInfo *pRVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<RCCFileInfo_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<RCCFileInfo_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppRVar3 = QArrayDataPointer<RCCFileInfo_*>::end(in_RDI);
      *ppRVar3 = (RCCFileInfo *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<RCCFileInfo_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppRVar3 = QArrayDataPointer<RCCFileInfo_*>::begin
                          ((QArrayDataPointer<RCCFileInfo_*> *)0x123027);
      ppRVar3[-1] = (RCCFileInfo *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pRVar5 = (RCCFileInfo *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<RCCFileInfo_*>::detachAndGrow
            ((QArrayDataPointer<RCCFileInfo_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pRVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (RCCFileInfo ***)in_stack_ffffffffffffffc8,in_RDI);
  ppRVar3 = QPodArrayOps<RCCFileInfo_*>::createHole
                      ((QPodArrayOps<RCCFileInfo_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pRVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppRVar3 = pRVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }